

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::Clear(ItemSimilarityRecommender *this)

{
  InternalMetadata *this_00;
  StringVector *this_01;
  ulong uVar1;
  Int64Vector *this_02;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->iteminputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->numrecommendationsinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemrestrictioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemexclusioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemlistoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemscoreoutputfeaturename_);
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  uVar3 = uVar3 & 1;
  puVar4 = puVar2;
  if (uVar3 != 0) {
    puVar4 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar4 == (undefined8 *)0x0) &&
     (this_01 = this->itemstringids_, this_01 != (StringVector *)0x0)) {
    StringVector::~StringVector(this_01);
    operator_delete(this_01,0x30);
    uVar1 = this_00->ptr_;
    uVar3 = (ulong)((uint)uVar1 & 1);
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  }
  this->itemstringids_ = (StringVector *)0x0;
  if (uVar3 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_02 = this->itemint64ids_, this_02 != (Int64Vector *)0x0)) {
    Int64Vector::~Int64Vector(this_02);
    operator_delete(this_02,0x28);
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>(this_00);
  return;
}

Assistant:

void ItemSimilarityRecommender::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ItemSimilarityRecommender)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  itemitemsimilarities_.Clear();
  iteminputfeaturename_.ClearToEmpty();
  numrecommendationsinputfeaturename_.ClearToEmpty();
  itemrestrictioninputfeaturename_.ClearToEmpty();
  itemexclusioninputfeaturename_.ClearToEmpty();
  recommendeditemlistoutputfeaturename_.ClearToEmpty();
  recommendeditemscoreoutputfeaturename_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && itemstringids_ != nullptr) {
    delete itemstringids_;
  }
  itemstringids_ = nullptr;
  if (GetArenaForAllocation() == nullptr && itemint64ids_ != nullptr) {
    delete itemint64ids_;
  }
  itemint64ids_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}